

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O2

sexp sexp_adjust_bytecode(sexp dstp,_func_sexp_void_ptr_sexp *adjust_fn,void *adata)

{
  sexp psVar1;
  size_t sVar2;
  int iVar3;
  undefined1 *puVar4;
  sexp psVar5;
  char *__format;
  
  puVar4 = (undefined1 *)0x0;
  do {
    iVar3 = (int)puVar4;
    psVar5 = (sexp)(long)iVar3;
    if ((dstp->value).type.getters <= psVar5) {
      return (sexp)&DAT_0000013e;
    }
    puVar4 = (undefined1 *)((long)&psVar5->tag + 1);
    switch((dstp->value).flonum_bits[(long)(&(psVar5->value).flonum + 4)]) {
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\x0f':
    case '\x12':
    case '\x13':
    case '\x14':
      psVar1 = *(sexp *)((long)&dstp->value + (long)((long)&psVar5->value + 0x21));
      if (((ulong)psVar1 & 3) == 0 && psVar1 != (sexp)0x0) {
        psVar1 = (*adjust_fn)(adata,psVar1);
        if (((ulong)psVar1 & 3) != 0) {
          __format = " from adjust bytecode, FCALLN";
LAB_0011d854:
          sVar2 = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sVar2,0x100 - sVar2,__format);
          return (sexp)&DAT_0000003e;
        }
        *(sexp *)((long)&dstp->value + (long)((long)&psVar5->value + 0x21)) = psVar1;
      }
    case '\r':
    case '\x0e':
    case '\x15':
    case '\x16':
    case '\x17':
    case '\x18':
    case '/':
      puVar4 = (undefined1 *)(ulong)(iVar3 + 9);
      break;
    case '&':
      psVar1 = *(sexp *)((long)&dstp->value + (long)((long)&psVar5->value + 0x31));
      if (((ulong)psVar1 & 3) == 0 && psVar1 != (sexp)0x0) {
        psVar1 = (*adjust_fn)(adata,psVar1);
        if (((ulong)psVar1 & 3) != 0) {
          __format = " from adjust bytecode, PROCEDURE";
          goto LAB_0011d854;
        }
        *(sexp *)((long)&dstp->value + (long)((long)&psVar5->value + 0x31)) = psVar1;
      }
      puVar4 = (undefined1 *)(ulong)(iVar3 + 0x19);
      break;
    case '0':
    case '1':
    case '2':
      puVar4 = (undefined1 *)(ulong)(iVar3 + 0x11);
    }
  } while( true );
}

Assistant:

static sexp sexp_adjust_bytecode(sexp dstp, sexp (*adjust_fn)(void *, sexp), void *adata) {
  sexp res = SEXP_FALSE;
  sexp   src, dst;
  sexp*  vec;
  int    i;
  
  for (i=0; i < sexp_bytecode_length(dstp); ) {
    switch (sexp_bytecode_data(dstp)[i++]) {
    case SEXP_OP_FCALL0:      case SEXP_OP_FCALL1:
    case SEXP_OP_FCALL2:      case SEXP_OP_FCALL3:
    case SEXP_OP_FCALL4:      case SEXP_OP_CALL:
    case SEXP_OP_TAIL_CALL:   case SEXP_OP_PUSH:
    case SEXP_OP_GLOBAL_REF:  case SEXP_OP_GLOBAL_KNOWN_REF:
#if SEXP_USE_GREEN_THREADS
    case SEXP_OP_PARAMETER_REF:
#endif
#if SEXP_USE_EXTENDED_FCALL
    case SEXP_OP_FCALLN:
#endif
      vec = (sexp*)(&(sexp_bytecode_data(dstp)[i]));
      src = vec[0];
      if (src && sexp_pointerp(src)) {
        dst = adjust_fn(adata, src);
        if (!sexp_pointerp(dst)) {
          size_t sz = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust bytecode, FCALLN");
          goto done; }
        vec[0] = dst;
      }
      /* ... FALLTHROUGH ... */
    case SEXP_OP_JUMP:        case SEXP_OP_JUMP_UNLESS:
    case SEXP_OP_STACK_REF:   case SEXP_OP_CLOSURE_REF:
    case SEXP_OP_LOCAL_REF:   case SEXP_OP_LOCAL_SET:
    case SEXP_OP_TYPEP:
#if SEXP_USE_RESERVE_OPCODE
    case SEXP_OP_RESERVE:
#endif
      i += sizeof(sexp); break;
    case SEXP_OP_MAKE: case SEXP_OP_SLOT_REF: case SEXP_OP_SLOT_SET:
      i += 2*sizeof(sexp); break;
    case SEXP_OP_MAKE_PROCEDURE:
      vec = (sexp*)(&(sexp_bytecode_data(dstp)[i]));
      src = vec[2];
      if (src && sexp_pointerp(src)) {
        dst = adjust_fn(adata, src);
        if (!sexp_pointerp(dst)) { 
          size_t sz = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust bytecode, PROCEDURE");
          goto done; }
        vec[2] = dst;
      }
      i += 3*sizeof(sexp); break;
    }
  }
  res = SEXP_TRUE;
done:
  return res;
}